

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * Catch::runTests(Totals *__return_storage_ptr__,Ptr<Catch::Config> *config)

{
  TestCase *pTVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  Ptr<const_Catch::IConfig> PVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  TestSpecParser *this;
  IRegistryHub *pIVar8;
  undefined4 extraout_var_00;
  long *plVar9;
  TestCase *testCase;
  Ptr<const_Catch::IConfig> iconfig;
  Ptr<Catch::IStreamingReporter> reporter;
  RunContext context;
  Ptr<const_Catch::IConfig> local_350;
  Ptr<Catch::IStreamingReporter> local_348;
  Ptr<Catch::IStreamingReporter> local_340;
  TestSpec local_338;
  string local_318;
  undefined1 local_2f8 [32];
  size_type local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2d0;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  TagAliasRegistry *local_290;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_288;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_268;
  RunContext local_248;
  
  local_350.m_p = (IConfig *)config->m_p;
  if ((Config *)local_350.m_p != (Config *)0x0) {
    (*(((Config *)local_350.m_p)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
      super_NonCopyable._vptr_NonCopyable[2])();
  }
  makeReporter((Catch *)&local_348,config);
  local_340.m_p = local_348.m_p;
  if (local_348.m_p != (IStreamingReporter *)0x0) {
    (*((local_348.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  addListeners((Catch *)&local_248,&local_350,&local_340);
  Ptr<Catch::IStreamingReporter>::operator=(&local_348,(Ptr<Catch::IStreamingReporter> *)&local_248)
  ;
  if (local_248.super_IResultCapture._vptr_IResultCapture != (_func_int **)0x0) {
    (**(code **)(*local_248.super_IResultCapture._vptr_IResultCapture + 0x18))();
  }
  if (local_340.m_p != (IStreamingReporter *)0x0) {
    (*((local_340.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  RunContext::RunContext(&local_248,&local_350,&local_348);
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->testCases).failedButOk = 0;
  *(undefined1 (*) [16])&(__return_storage_ptr__->assertions).failedButOk = (undefined1  [16])0x0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  (*(config->m_p->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
    _vptr_NonCopyable[6])(local_2f8);
  RunContext::testGroupStarting(&local_248,(string *)local_2f8,1,1);
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
  }
  iVar7 = (*(config->m_p->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
            super_NonCopyable._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_338.m_filters,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar7));
  if (local_338.m_filters.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_338.m_filters.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    TagAliasRegistry::get();
    local_2d8 = 0;
    aStack_2d0._M_local_buf[0] = '\0';
    local_2c0 = (undefined1  [16])0x0;
    local_2b0 = (undefined1  [16])0x0;
    local_2a0 = (undefined1  [16])0x0;
    local_290 = &TagAliasRegistry::get::instance;
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    local_2f8._24_8_ = &aStack_2d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"~[.]","");
    this = TestSpecParser::parse((TestSpecParser *)local_2f8,&local_318);
    TestSpecParser::addFilter(this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              (&local_288,&(this->m_testSpec).m_filters);
    local_268.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_338.m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_338.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_288.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_338.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_288.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_338.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_288.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_288.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_268);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               (local_2b0 + 8));
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
               *)local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._24_8_ != &aStack_2d0) {
      operator_delete((void *)local_2f8._24_8_,
                      CONCAT71(aStack_2d0._M_allocated_capacity._1_7_,aStack_2d0._M_local_buf[0]) +
                      1);
    }
  }
  PVar5.m_p = local_350.m_p;
  pIVar8 = getRegistryHub();
  iVar7 = (*pIVar8->_vptr_IRegistryHub[3])(pIVar8);
  plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x18))
                             ((long *)CONCAT44(extraout_var_00,iVar7),PVar5.m_p);
  testCase = (TestCase *)*plVar9;
  pTVar1 = (TestCase *)plVar9[1];
  if (testCase != pTVar1) {
    do {
      sVar2 = local_248.m_totals.assertions.failed;
      iVar7 = (*((local_248.m_config.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])()
      ;
      PVar5.m_p = local_350.m_p;
      if (sVar2 == (long)iVar7) {
LAB_001305c3:
        (*((local_348.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])
                  (local_348.m_p,testCase);
      }
      else {
        bVar6 = TestSpec::matches(&local_338,&testCase->super_TestCaseInfo);
        if (!bVar6) goto LAB_001305c3;
        iVar7 = (*(((SharedImpl<Catch::IConfig> *)&(PVar5.m_p)->super_IShared)->super_IConfig).
                  super_IShared.super_NonCopyable._vptr_NonCopyable[4])(PVar5.m_p);
        if (((char)iVar7 == '\0') && (((testCase->super_TestCaseInfo).properties & Throws) != None))
        goto LAB_001305c3;
        RunContext::runTest((Totals *)local_2f8,&local_248,testCase);
        sVar2 = (__return_storage_ptr__->testCases).passed;
        sVar3 = (__return_storage_ptr__->testCases).failed;
        sVar4 = (__return_storage_ptr__->testCases).failedButOk;
        (__return_storage_ptr__->assertions).passed =
             (size_t)(local_2f8._0_8_ + (__return_storage_ptr__->assertions).passed);
        (__return_storage_ptr__->assertions).failed =
             (__return_storage_ptr__->assertions).failed + local_2f8._8_8_;
        (__return_storage_ptr__->assertions).failedButOk =
             (__return_storage_ptr__->assertions).failedButOk + local_2f8._16_8_;
        (__return_storage_ptr__->testCases).passed = (size_t)(sVar2 + local_2f8._24_8_);
        (__return_storage_ptr__->testCases).failed = sVar3 + local_2d8;
        (__return_storage_ptr__->testCases).failedButOk =
             sVar4 + CONCAT71(aStack_2d0._M_allocated_capacity._1_7_,aStack_2d0._M_local_buf[0]);
      }
      testCase = testCase + 1;
    } while (testCase != pTVar1);
  }
  (*(((SharedImpl<Catch::IConfig> *)&(local_350.m_p)->super_IShared)->super_IConfig).super_IShared.
    super_NonCopyable._vptr_NonCopyable[6])(local_2f8);
  RunContext::testGroupEnded(&local_248,(string *)local_2f8,__return_storage_ptr__,1,1);
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
  }
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_338.m_filters);
  RunContext::~RunContext(&local_248);
  if (local_348.m_p != (IStreamingReporter *)0x0) {
    (*((local_348.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  if ((Config *)local_350.m_p != (Config *)0x0) {
    (*(((SharedImpl<Catch::IConfig> *)&(local_350.m_p)->super_IShared)->super_IConfig).super_IShared
      .super_NonCopyable._vptr_NonCopyable[3])();
  }
  return __return_storage_ptr__;
}

Assistant:

Totals runTests( Ptr<Config> const& config ) {

        Ptr<IConfig const> iconfig = config.get();

        Ptr<IStreamingReporter> reporter = makeReporter( config );
        reporter = addListeners( iconfig, reporter );

        RunContext context( iconfig, reporter );

        Totals totals;

        context.testGroupStarting( config->name(), 1, 1 );

        TestSpec testSpec = config->testSpec();
        if( !testSpec.hasFilters() )
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "~[.]" ).testSpec(); // All not hidden tests

        std::vector<TestCase> const& allTestCases = getAllTestCasesSorted( *iconfig );
        for( std::vector<TestCase>::const_iterator it = allTestCases.begin(), itEnd = allTestCases.end();
                it != itEnd;
                ++it ) {
            if( !context.aborting() && matchTest( *it, testSpec, *iconfig ) )
                totals += context.runTest( *it );
            else
                reporter->skipTest( *it );
        }

        context.testGroupEnded( iconfig->name(), totals, 1, 1 );
        return totals;
    }